

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall
fineftp::FtpSession::sendFtpMessage(FtpSession *this,FtpReplyCode code,string *message)

{
  pointer pcVar1;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_38._0_4_ = code;
  local_30._M_p = (pointer)&local_20;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + message->_M_string_length);
  sendFtpMessage(this,(FtpMessage *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FtpSession::sendFtpMessage(FtpReplyCode code, const std::string& message)
  {
    sendFtpMessage(FtpMessage(code, message));
  }